

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O1

void __thiscall reader_url_suite::test_fragment_question::test_method(test_fragment_question *this)

{
  bool bVar1;
  int iVar2;
  view_type local_314;
  uint local_304;
  uint *local_300;
  view_type local_2f8;
  undefined8 *local_2e8;
  undefined1 *local_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  uint **local_2c0;
  undefined1 local_2b8 [8];
  undefined8 local_2b0;
  shared_count sStack_2a8;
  undefined **local_2a0;
  undefined1 local_298;
  undefined8 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  url reader;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char input [41];
  
  local_2f8.ptr_ = input;
  builtin_strncpy(input + 0x20,"nt?query",9);
  builtin_strncpy(input + 0x10,".com/path#fragme",0x10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_2f8.len_ = strlen(local_2f8.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_2f8);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x106);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_314._4_8_ = &local_314;
  local_314.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_300 = &local_304;
  local_2b8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_304 = 2;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2c0 = &local_300;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x107);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"scheme",6
                );
    local_2b8[0] = iVar2 == 0;
  }
  else {
    local_2b8[0] = false;
  }
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x16fe2f;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186358;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x107,2,2,2,"reader.literal()",&local_2f8,"\"scheme\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x108);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314.ptr_._0_4_ = CONCAT31(local_314.ptr_._1_3_,local_2b8[0]);
  local_304 = CONCAT31(local_304._1_3_,1);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_300 = &local_304;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x108,2,2,2,"reader.next()",&local_2f8,"true",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x109);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 authority_host_name;
  local_314.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_304 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_300 = &local_304;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x109,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::authority_host_name",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x10a);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xb) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,
                 "example.com",0xb);
    local_2b8[0] = iVar2 == 0;
  }
  else {
    local_2b8[0] = false;
  }
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x16f1f0;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186458;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10a,2,2,2,"reader.literal()",&local_2f8,
             "\"example.com\"",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x10b);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314.ptr_._0_4_ = CONCAT31(local_314.ptr_._1_3_,local_2b8[0]);
  local_304 = CONCAT31(local_304._1_3_,1);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_300 = &local_304;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10b,2,2,2,"reader.next()",&local_2f8,"true",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x10c);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_314.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_304 = 8;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_300 = &local_304;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10c,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x10d);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"path",4);
    local_2b8[0] = iVar2 == 0;
  }
  else {
    local_2b8[0] = false;
  }
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x16ffdb;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186698;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10d,2,2,2,"reader.literal()",&local_2f8,"\"path\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x10e);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314.ptr_._0_4_ = CONCAT31(local_314.ptr_._1_3_,local_2b8[0]);
  local_304 = CONCAT31(local_304._1_3_,1);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_300 = &local_304;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10e,2,2,2,"reader.next()",&local_2f8,"true",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x10f);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_2b8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == fragment;
  local_314.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_304 = 0xc;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_300 = &local_304;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x10f,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::fragment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x110);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xe) {
    iVar2 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,
                 "fragment?query",0xe);
    local_2b8[0] = iVar2 == 0;
  }
  else {
    local_2b8[0] = false;
  }
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x1700cf;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186718;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x110,2,2,2,"reader.literal()",&local_2f8,
             "\"fragment?query\"",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x111);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00186260;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_314.ptr_._0_4_ = CONCAT31(local_314.ptr_._1_3_,bVar1);
  local_304 = local_304 & 0xffffff00;
  local_2b8[0] = !bVar1;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_314._4_8_ = &local_314;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (undefined1 *)((long)&local_314.ptr_ + 4);
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_300 = &local_304;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x111,2,2,2,"reader.next()",&local_2f8,"false",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_fragment_question)
{
    const char input[] = "scheme://example.com/path#fragment?query";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::fragment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "fragment?query");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}